

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O3

void If_ManImproveMapping(If_Man_t *p)

{
  If_Cut_t *pCut;
  ulong uVar1;
  uint uVar2;
  If_Obj_t *pObj;
  void *pvVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *vFront;
  void **ppvVar6;
  Vec_Ptr_t *vFront_00;
  void **ppvVar7;
  Vec_Ptr_t *vVisited;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  If_Obj_t *pObj_00;
  If_Man_t *pIVar12;
  ulong uVar13;
  size_t __size;
  float fVar14;
  float fVar15;
  float fVar16;
  timespec ts;
  ulong local_80;
  int local_74;
  long local_60;
  timespec local_50;
  ulong local_40;
  long local_38;
  
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_60 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  uVar2 = p->pPars->nLutSize;
  vFront = (Vec_Ptr_t *)malloc(0x10);
  local_80 = 8;
  if (6 < uVar2 - 1) {
    local_80 = (ulong)uVar2;
  }
  vFront->nSize = 0;
  iVar4 = (int)local_80;
  vFront->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar4 * 8);
  }
  vFront->pArray = ppvVar6;
  vFront_00 = (Vec_Ptr_t *)malloc(0x10);
  vFront_00->nSize = 0;
  vFront_00->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar4 << 3);
  }
  vFront_00->pArray = ppvVar7;
  vVisited = (Vec_Ptr_t *)malloc(0x10);
  vVisited->nCap = 100;
  vVisited->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vVisited->pArray = ppvVar7;
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    local_40 = (ulong)uVar2;
    do {
      pObj = (If_Obj_t *)pVVar8->pArray[lVar10];
      if (((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) {
        pCut = &pObj->CutBest;
        fVar14 = If_CutDelay(p,pObj,pCut);
        (pObj->CutBest).Delay = fVar14;
        if (pObj->Required + p->fEpsilon < fVar14) {
          __assert_fail("pCut->Delay <= pObj->Required + p->fEpsilon",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                        ,0x88,
                        "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        if (pObj->nRefs != 0) {
          fVar15 = If_CutAreaRefed(p,pCut);
          iVar4 = 0;
          vFront->nSize = 0;
          vFront_00->nSize = 0;
          vVisited->nSize = 0;
          local_38 = lVar10;
          if (*(uint *)&(pObj->CutBest).field_0x1c < 0x1000000) {
            uVar13 = 0;
          }
          else {
            __size = 0;
            local_74 = 0;
            uVar13 = 0;
            do {
              iVar5 = *(int *)(&pObj[1].field_0x0 + uVar13 * 4);
              if (((long)iVar5 < 0) || (p->vObjs->nSize <= iVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar3 = p->vObjs->pArray[iVar5];
              if (pvVar3 == (void *)0x0) goto LAB_0043304e;
              if (uVar13 == (uint)vFront->nCap) {
                ppvVar6 = vFront->pArray;
                if (uVar13 < 0x10) {
                  if (ppvVar6 == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(ppvVar6,0x80);
                  }
                  vFront->pArray = ppvVar6;
                  vFront->nCap = 0x10;
                }
                else {
                  if (ppvVar6 == (void **)0x0) {
                    ppvVar6 = (void **)malloc(__size);
                  }
                  else {
                    ppvVar6 = (void **)realloc(ppvVar6,__size);
                  }
                  vFront->pArray = ppvVar6;
                  vFront->nCap = local_74;
                }
              }
              else {
                ppvVar6 = vFront->pArray;
              }
              uVar1 = uVar13 + 1;
              vFront->nSize = (int)uVar1;
              ppvVar6[uVar13] = pvVar3;
              if (uVar13 == local_80) {
                if ((int)local_80 < 0x10) {
                  if (vFront_00->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vFront_00->pArray,0x80);
                  }
                  vFront_00->pArray = ppvVar6;
                  vFront_00->nCap = 0x10;
                  local_80 = 0x10;
                }
                else {
                  uVar2 = (int)local_80 * 2;
                  local_80 = (ulong)uVar2;
                  if (vFront_00->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(local_80 * 8);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vFront_00->pArray,local_80 * 8);
                  }
                  vFront_00->pArray = ppvVar6;
                  vFront_00->nCap = uVar2;
                }
              }
              else {
                ppvVar6 = vFront_00->pArray;
              }
              vFront_00->nSize = (int)uVar1;
              ppvVar6[uVar13] = pvVar3;
              uVar2 = vVisited->nSize;
              if (uVar2 == vVisited->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (vVisited->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
                  }
                  vVisited->pArray = ppvVar6;
                  vVisited->nCap = 0x10;
                }
                else {
                  if (vVisited->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar2 << 4);
                  }
                  vVisited->pArray = ppvVar6;
                  vVisited->nCap = uVar2 * 2;
                }
              }
              else {
                ppvVar6 = vVisited->pArray;
              }
              iVar5 = vVisited->nSize;
              vVisited->nSize = iVar5 + 1;
              ppvVar6[iVar5] = pvVar3;
              *(byte *)((long)pvVar3 + 1) = *(byte *)((long)pvVar3 + 1) | 1;
              local_74 = local_74 + 2;
              __size = __size + 0x10;
              uVar13 = uVar1;
            } while (uVar1 < (byte)(pObj->CutBest).field_0x1f);
            uVar13 = uVar1 & 0xffffffff;
          }
LAB_0043304e:
          If_ManImproveMark_rec(p,pObj,vVisited);
          pObj_00 = (If_Obj_t *)pCut;
          pIVar12 = p;
          If_CutAreaDeref(p,pCut);
          uVar1 = local_40;
          if (0 < (int)uVar13) {
            uVar11 = 0;
            iVar4 = 0;
            do {
              pObj_00 = (If_Obj_t *)vFront->pArray[uVar11];
              iVar4 = iVar4 + (uint)(pObj_00->nRefs == 0);
              uVar11 = uVar11 + 1;
            } while ((uVar13 & 0xffffffff) != uVar11);
          }
          do {
            iVar5 = If_ManImproveNodeFaninCompact_int(pIVar12,pObj_00,(int)uVar1,vFront,vVisited);
          } while (iVar5 != 0);
          if ((long)vFront->nSize < 1) {
            iVar5 = 0;
          }
          else {
            lVar10 = 0;
            iVar5 = 0;
            do {
              iVar5 = iVar5 + (uint)(*(int *)((long)vFront->pArray[lVar10] + 0xc) == 0);
              lVar10 = lVar10 + 1;
            } while (vFront->nSize != lVar10);
          }
          If_CutAreaRef(p,pCut);
          lVar10 = local_38;
          if (iVar4 < iVar5) {
            __assert_fail("CostBef >= CostAft",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                          ,0x99,
                          "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          if (0 < vVisited->nSize) {
            lVar9 = 0;
            do {
              *(uint *)vVisited->pArray[lVar9] = *vVisited->pArray[lVar9] & 0xfffffeff;
              lVar9 = lVar9 + 1;
            } while (lVar9 < vVisited->nSize);
          }
          If_ManImproveNodeUpdate(p,pObj,vFront);
          fVar16 = If_CutDelay(p,pObj,pCut);
          (pObj->CutBest).Delay = fVar16;
          fVar16 = If_CutAreaRefed(p,pCut);
          if ((fVar15 < fVar16) || (pObj->Required + p->fEpsilon < (pObj->CutBest).Delay)) {
            If_ManImproveNodeUpdate(p,pObj,vFront_00);
            fVar16 = If_CutAreaRefed(p,pCut);
            if ((fVar16 != fVar15) || (NAN(fVar16) || NAN(fVar15))) {
              __assert_fail("AreaAft == AreaBef",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                            ,0xa6,
                            "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                           );
            }
            (pObj->CutBest).Delay = fVar14;
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar8 = p->vObjs;
    } while (lVar10 < pVVar8->nSize);
    ppvVar6 = vFront->pArray;
  }
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
  }
  free(vFront);
  if (vFront_00->pArray != (void **)0x0) {
    free(vFront_00->pArray);
  }
  free(vFront_00);
  if (vVisited->pArray != (void **)0x0) {
    free(vVisited->pArray);
  }
  free(vVisited);
  pIVar12 = p;
  If_ManComputeRequired(p);
  iVar4 = (int)pIVar12;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(iVar4,"E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ",(double)p->RequiredGlo,
              (ulong)(uint)p->nNets);
    fVar14 = p->dPower;
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      Abc_Print(iVar4,"Switch = %7.2f.  ",(double)fVar14);
    }
    Abc_Print(iVar4,"Cut = %8d.  ",(ulong)(uint)p->nCutsMerged);
    iVar5 = 3;
    iVar4 = clock_gettime(3,&local_50);
    if (iVar4 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","T");
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar10 + local_60) / 1000000.0);
  }
  return;
}

Assistant:

void If_ManImproveMapping( If_Man_t * p )
{
    abctime clk;

    clk = Abc_Clock();
    If_ManImproveExpand( p, p->pPars->nLutSize );
    If_ManComputeRequired( p );
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ", 
            p->RequiredGlo, p->AreaGlo, p->nNets );
        if ( p->dPower )
        Abc_Print( 1, "Switch = %7.2f.  ", p->dPower );
        Abc_Print( 1, "Cut = %8d.  ", p->nCutsMerged );
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }
}